

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_common.c
# Opt level: O0

lzma_ret lzma_raw_coder_init(lzma_next_coder *next,lzma_allocator *allocator,lzma_filter *options,
                            lzma_filter_find coder_find,_Bool is_encoder)

{
  long lVar1;
  long lVar2;
  lzma_filter_coder *plVar3;
  lzma_filter_coder *fc_1;
  lzma_filter_coder *fc;
  size_t j;
  lzma_ret ret_;
  lzma_ret ret;
  size_t i;
  size_t count;
  lzma_filter_info filters [5];
  _Bool is_encoder_local;
  lzma_filter_find coder_find_local;
  lzma_filter *options_local;
  lzma_allocator *allocator_local;
  lzma_next_coder *next_local;
  
  next_local._4_4_ = validate_chain(options,&i);
  if (next_local._4_4_ == LZMA_OK) {
    if (is_encoder) {
      for (_ret_ = 0; _ret_ < i; _ret_ = _ret_ + 1) {
        lVar1 = i - _ret_;
        lVar2 = lVar1 + -1;
        plVar3 = (*coder_find)(options[_ret_].id);
        if ((plVar3 == (lzma_filter_coder *)0x0) || (plVar3->init == (lzma_init_function)0x0)) {
          return LZMA_OPTIONS_ERROR;
        }
        filters[lVar1 + -2].options = (void *)options[_ret_].id;
        filters[lVar2].id = (lzma_vli)plVar3->init;
        filters[lVar2].init = (lzma_init_function_conflict8)options[_ret_].options;
      }
    }
    else {
      for (_ret_ = 0; _ret_ < i; _ret_ = _ret_ + 1) {
        plVar3 = (*coder_find)(options[_ret_].id);
        if ((plVar3 == (lzma_filter_coder *)0x0) || (plVar3->init == (lzma_init_function)0x0)) {
          return LZMA_OPTIONS_ERROR;
        }
        filters[_ret_ - 1].options = (void *)options[_ret_].id;
        filters[_ret_].id = (lzma_vli)plVar3->init;
        filters[_ret_].init = (lzma_init_function_conflict8)options[_ret_].options;
      }
    }
    filters[i - 1].options = (void *)0xffffffffffffffff;
    filters[i].id = 0;
    next_local._4_4_ = lzma_next_filter_init(next,allocator,(lzma_filter_info *)&count);
    if (next_local._4_4_ != LZMA_OK) {
      lzma_next_end(next,allocator);
    }
  }
  return next_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_raw_coder_init(lzma_next_coder *next, lzma_allocator *allocator,
		const lzma_filter *options,
		lzma_filter_find coder_find, bool is_encoder)
{
	lzma_filter_info filters[LZMA_FILTERS_MAX + 1];
	size_t count;
	size_t i;
	lzma_ret ret;

	// Do some basic validation and get the number of filters.
	return_if_error(validate_chain(options, &count));

	// Set the filter functions and copy the options pointer.
	if (is_encoder) {
		for (i = 0; i < count; ++i) {
			// The order of the filters is reversed in the
			// encoder. It allows more efficient handling
			// of the uncompressed data.
			const size_t j = count - i - 1;

			const lzma_filter_coder *const fc
					= coder_find(options[i].id);
			if (fc == NULL || fc->init == NULL)
				return LZMA_OPTIONS_ERROR;

			filters[j].id = options[i].id;
			filters[j].init = fc->init;
			filters[j].options = options[i].options;
		}
	} else {
		for (i = 0; i < count; ++i) {
			const lzma_filter_coder *const fc
					= coder_find(options[i].id);
			if (fc == NULL || fc->init == NULL)
				return LZMA_OPTIONS_ERROR;

			filters[i].id = options[i].id;
			filters[i].init = fc->init;
			filters[i].options = options[i].options;
		}
	}

	// Terminate the array.
	filters[count].id = LZMA_VLI_UNKNOWN;
	filters[count].init = NULL;

	// Initialize the filters.
	ret = lzma_next_filter_init(next, allocator, filters);
	if (ret != LZMA_OK)
		lzma_next_end(next, allocator);

	return ret;
}